

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

int __thiscall
CVmObjDate::getp_getISOWeekDate(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  CVmTimeZone *this_00;
  uint argc;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iy;
  int32_t daytime;
  caldate_t cd;
  uint local_34;
  uint local_30;
  caldate_t local_2c;
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  if (getp_getISOWeekDate(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getISOWeekDate();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getISOWeekDate::desc);
  if (iVar2 == 0) {
    this_00 = get_tz_arg(0,argc);
    puVar1 = (uint *)(this->super_CVmObject).ext_;
    local_34 = *puVar1;
    local_30 = puVar1[1];
    CVmTimeZone::utc_to_local(this_00,(int32_t *)&local_34,(int32_t *)&local_30,&local_2c.y);
    caldate_t::set_dayno(&local_2c,local_34);
    uVar3 = caldate_t::iso_weekno(&local_2c,(int *)&local_34);
    uVar4 = (uint)((long)local_2c.m < 3);
    iVar5 = local_2c.y - uVar4;
    iVar2 = (local_2c.y - uVar4) + 3;
    if (-1 < iVar5) {
      iVar2 = iVar5;
    }
    iVar6 = (int)((ulong)((long)iVar5 * -0x51eb851f) >> 0x20);
    uVar4 = (iVar5 + local_2c.d + *(int *)(&DAT_002ca35c + (long)local_2c.m * 4) + (iVar2 >> 2) +
             ((iVar6 >> 5) - (iVar6 >> 0x1f)) + iVar5 / 400) % 7;
    uVar7 = 7;
    if (uVar4 != 0) {
      uVar7 = (ulong)uVar4;
    }
    make_int_list(retval,3,(ulong)local_34,(ulong)uVar3,uVar7);
    sp_ = sp_ + -(long)(int)argc;
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_getISOWeekDate(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get my date in local time */
    int32_t dayno = get_local_date(get_tz_arg(vmg_ 0, argc));

    /* express it as a calendar date */
    caldate_t cd(dayno);

    /* return [iso year, iso week, iso day] */
    int iy;
    int iw = cd.iso_weekno(&iy);
    make_int_list(vmg_ retval, 3, iy, iw, cd.iso_weekday());

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}